

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.cpp
# Opt level: O1

utf8proc_ssize_t
duckdb::utf8proc_decompose_char
          (utf8proc_int32_t uc,utf8proc_int32_t *dst,utf8proc_ssize_t bufsize,
          utf8proc_option_t options,int *last_boundclass)

{
  uint uVar1;
  long lVar2;
  ushort uVar3;
  utf8proc_bool uVar4;
  utf8proc_ssize_t uVar5;
  utf8proc_uint16_t seqindex;
  ulong uVar6;
  
LAB_002353ec:
  while( true ) {
    while( true ) {
      while( true ) {
        if (0x10ffff < (uint)uc) {
          return -4;
        }
        uVar1 = uc - 0xac00;
        if (uVar1 < 0x2ba4 && (options & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) != 0) {
          if ((0 < bufsize) && (*dst = uVar1 / 0x24c | 0x1100, bufsize != 1)) {
            dst[1] = (uVar1 % 0x24c) / 0x1c + 0x1161;
          }
          if (uVar1 % 0x1c == 0) {
            return 2;
          }
          if (2 < bufsize) {
            dst[2] = uVar1 % 0x1c + 0x11a7;
            return 3;
          }
          return 3;
        }
        uVar6 = (ulong)*(ushort *)
                        (&utf8proc_stage2table +
                        (ulong)((uc & 0xffU) + (uint)(ushort)(&utf8proc_stage1table)[(uint)uc >> 8])
                        * 2);
        uVar3 = (&utf8proc_properties)[uVar6 * 0xc];
        if (((options & UTF8PROC_REJECTNA) != 0) && (uVar3 == 0)) {
          return -4;
        }
        lVar2 = uVar6 * 0x18;
        if (((options & UTF8PROC_IGNORE) != 0) &&
           ((*(byte *)(&DAT_012dd174 + uVar6 * 0xc) & 4) != 0)) {
          return 0;
        }
        if (((options >> 0xe & 1) != 0) && (uVar3 == 0)) {
          return 0;
        }
        if ((options >> 0xc & 1) == 0) goto LAB_00235724;
        if (uVar3 != 0x17) break;
        options = options & ~UTF8PROC_LUMP;
        uc = 0x20;
      }
      if ((((uc & 0x1ffffeU) != 0x2018) && (uc != 0x2c8)) && (uc != 700)) break;
      options = options & ~UTF8PROC_LUMP;
      uc = 0x27;
    }
    if ((uc != 0x2212) && (uVar3 != 0xd)) break;
    options = options & ~UTF8PROC_LUMP;
    uc = 0x2d;
  }
  if (uc < 0x2236) {
    if (uc < 0x2044) {
      if (uc == 0x2039) goto LAB_00235597;
      if (uc == 0x203a) goto LAB_00235574;
    }
    else {
      if ((uc == 0x2044) || (uc == 0x2215)) {
        options = options & ~UTF8PROC_LUMP;
        uc = 0x2f;
        goto LAB_002353ec;
      }
      if (uc == 0x2216) {
        options = options & ~UTF8PROC_LUMP;
        uc = 0x5c;
        goto LAB_002353ec;
      }
    }
  }
  else {
    if (0x2329 < uc) {
      if (uc != 0x232a) {
        if (uc == 0x3008) goto LAB_00235597;
        if (uc != 0x3009) goto LAB_002355ca;
      }
LAB_00235574:
      options = options & ~UTF8PROC_LUMP;
      uc = 0x3e;
      goto LAB_002353ec;
    }
    if (uc == 0x2236) {
      options = options & ~UTF8PROC_LUMP;
      uc = 0x3a;
      goto LAB_002353ec;
    }
    if (uc == 0x2329) {
LAB_00235597:
      options = options & ~UTF8PROC_LUMP;
      uc = 0x3c;
      goto LAB_002353ec;
    }
  }
LAB_002355ca:
  if ((((uc & 0x1ffffdU) == 0x2c4) || (uc == 0x2303)) || (uc == 0x2038)) {
    options = options & ~UTF8PROC_LUMP;
    uc = 0x5e;
  }
  else if ((uc == 0x2cd) || (uVar3 == 0xc)) {
    options = options & ~UTF8PROC_LUMP;
    uc = 0x5f;
  }
  else if (uc == 0x223c) {
    options = options & ~UTF8PROC_LUMP;
    uc = 0x7e;
  }
  else if (uc == 0x2223) {
    options = options & ~UTF8PROC_LUMP;
    uc = 0x7c;
  }
  else if (uc == 0x2cb) {
    options = options & ~UTF8PROC_LUMP;
    uc = 0x60;
  }
  else {
    if (((~options & 0x180) != 0) || ((uVar3 & 0xfffe) != 0x18)) {
LAB_00235724:
      if (((options >> 0xd & 1) != 0) && ((ushort)(uVar3 - 6) < 3)) {
        return 0;
      }
      if ((((options >> 10 & 1) == 0) ||
          (seqindex = *(utf8proc_uint16_t *)(&DAT_012dd16a + lVar2), seqindex == 0xffff)) &&
         (((options & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) == 0 ||
          ((seqindex = *(utf8proc_uint16_t *)(&DAT_012dd168 + lVar2), seqindex == 0xffff ||
           (((options & UTF8PROC_COMPAT) == 0 && (*(short *)(&DAT_012dd166 + lVar2) != 0)))))))) {
        if (((options >> 0xb & 1) != 0) &&
           (uVar4 = grapheme_break_extended
                              (0,(ushort)(&DAT_012dd174)[uVar6 * 0xc] >> 8 & 0x3f,0,
                               (uint)((ushort)(&DAT_012dd174)[uVar6 * 0xc] >> 0xe),last_boundclass),
           uVar4)) {
          if (0 < bufsize) {
            *dst = -1;
          }
          if (1 < bufsize) {
            dst[1] = uc;
          }
          if (uVar4) {
            return 2;
          }
        }
        if (0 < bufsize) {
          *dst = uc;
          return 1;
        }
        return 1;
      }
      uVar5 = seqindex_write_char_decomposed(seqindex,dst,bufsize,options,last_boundclass);
      return uVar5;
    }
    options = options & ~UTF8PROC_LUMP;
    uc = 10;
  }
  goto LAB_002353ec;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_decompose_char(utf8proc_int32_t uc, utf8proc_int32_t *dst, utf8proc_ssize_t bufsize, utf8proc_option_t options, int *last_boundclass) {
  const utf8proc_property_t *property;
  utf8proc_propval_t category;
  utf8proc_int32_t hangul_sindex;
  if (uc < 0 || uc >= 0x110000) return UTF8PROC_ERROR_NOTASSIGNED;
  property = unsafe_get_property(uc);
  category = property->category;
  hangul_sindex = uc - UTF8PROC_HANGUL_SBASE;
  if (options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) {
    if (hangul_sindex >= 0 && hangul_sindex < UTF8PROC_HANGUL_SCOUNT) {
      utf8proc_int32_t hangul_tindex;
      if (bufsize >= 1) {
        dst[0] = UTF8PROC_HANGUL_LBASE +
          hangul_sindex / UTF8PROC_HANGUL_NCOUNT;
        if (bufsize >= 2) dst[1] = UTF8PROC_HANGUL_VBASE +
          (hangul_sindex % UTF8PROC_HANGUL_NCOUNT) / UTF8PROC_HANGUL_TCOUNT;
      }
      hangul_tindex = hangul_sindex % UTF8PROC_HANGUL_TCOUNT;
      if (!hangul_tindex) return 2;
      if (bufsize >= 3) dst[2] = UTF8PROC_HANGUL_TBASE + hangul_tindex;
      return 3;
    }
  }
  if (options & UTF8PROC_REJECTNA) {
    if (!category) return UTF8PROC_ERROR_NOTASSIGNED;
  }
  if (options & UTF8PROC_IGNORE) {
    if (property->ignorable) return 0;
  }
  if (options & UTF8PROC_STRIPNA) {
    if (!category) return 0;
  }
  if (options & UTF8PROC_LUMP) {
    if (category == UTF8PROC_CATEGORY_ZS) utf8proc_decompose_lump(0x0020);
    if (uc == 0x2018 || uc == 0x2019 || uc == 0x02BC || uc == 0x02C8)
      utf8proc_decompose_lump(0x0027);
    if (category == UTF8PROC_CATEGORY_PD || uc == 0x2212)
      utf8proc_decompose_lump(0x002D);
    if (uc == 0x2044 || uc == 0x2215) utf8proc_decompose_lump(0x002F);
    if (uc == 0x2236) utf8proc_decompose_lump(0x003A);
    if (uc == 0x2039 || uc == 0x2329 || uc == 0x3008)
      utf8proc_decompose_lump(0x003C);
    if (uc == 0x203A || uc == 0x232A || uc == 0x3009)
      utf8proc_decompose_lump(0x003E);
    if (uc == 0x2216) utf8proc_decompose_lump(0x005C);
    if (uc == 0x02C4 || uc == 0x02C6 || uc == 0x2038 || uc == 0x2303)
      utf8proc_decompose_lump(0x005E);
    if (category == UTF8PROC_CATEGORY_PC || uc == 0x02CD)
      utf8proc_decompose_lump(0x005F);
    if (uc == 0x02CB) utf8proc_decompose_lump(0x0060);
    if (uc == 0x2223) utf8proc_decompose_lump(0x007C);
    if (uc == 0x223C) utf8proc_decompose_lump(0x007E);
    if ((options & UTF8PROC_NLF2LS) && (options & UTF8PROC_NLF2PS)) {
      if (category == UTF8PROC_CATEGORY_ZL ||
          category == UTF8PROC_CATEGORY_ZP)
        utf8proc_decompose_lump(0x000A);
    }
  }
  if (options & UTF8PROC_STRIPMARK) {
    if (category == UTF8PROC_CATEGORY_MN ||
      category == UTF8PROC_CATEGORY_MC ||
      category == UTF8PROC_CATEGORY_ME) return 0;
  }
  if (options & UTF8PROC_CASEFOLD) {
    if (property->casefold_seqindex != UINT16_MAX) {
      return seqindex_write_char_decomposed(property->casefold_seqindex, dst, bufsize, options, last_boundclass);
    }
  }
  if (options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) {
    if (property->decomp_seqindex != UINT16_MAX &&
        (!property->decomp_type || (options & UTF8PROC_COMPAT))) {
      return seqindex_write_char_decomposed(property->decomp_seqindex, dst, bufsize, options, last_boundclass);
        }
  }
  if (options & UTF8PROC_CHARBOUND) {
    utf8proc_bool boundary;
    boundary = grapheme_break_extended(0, property->boundclass, 0, property->indic_conjunct_break,
                                       last_boundclass);
    if (boundary) {
      if (bufsize >= 1) dst[0] = -1; /* sentinel value for grapheme break */
      if (bufsize >= 2) dst[1] = uc;
      return 2;
    }
  }
  if (bufsize >= 1) *dst = uc;
  return 1;
}